

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lys_submodule *
ly_ctx_get_submodule(ly_ctx *ctx,char *module,char *revision,char *submodule,char *sub_revision)

{
  lys_module *main_module;
  uint uVar1;
  int iVar2;
  lys_submodule *plVar3;
  LY_ERR *pLVar4;
  lys_submodule *plVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((submodule == (char *)0x0 || ctx == (ly_ctx *)0x0) ||
     (module == (char *)0x0 && revision != (char *)0x0)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
  }
  else {
    uVar1 = (ctx->models).used;
    uVar7 = 0;
    if (uVar1 != 0) {
      plVar5 = (lys_submodule *)0x0;
      do {
        while( true ) {
          uVar7 = uVar7 & 0xffffffff;
          while (main_module = (ctx->models).list[uVar7], (main_module->field_0x40 & 0x40) != 0) {
            uVar7 = uVar7 + 1;
            if (uVar1 <= uVar7) {
              return plVar5;
            }
          }
          if ((((module == (char *)0x0) || (iVar2 = strcmp(main_module->name,module), iVar2 == 0))
              && ((revision == (char *)0x0 ||
                  ((main_module->rev != (lys_revision *)0x0 &&
                   (iVar2 = strcmp(revision,main_module->rev->date), iVar2 == 0)))))) &&
             (plVar3 = ly_ctx_get_submodule2(main_module,submodule), plVar3 != (lys_submodule *)0x0)
             ) break;
LAB_00110014:
          uVar7 = uVar7 + 1;
          uVar1 = (ctx->models).used;
          if (uVar1 <= (uint)uVar7) {
            return plVar5;
          }
        }
        if (sub_revision == (char *)0x0) {
          if ((plVar5 == (lys_submodule *)0x0) ||
             ((plVar3->rev != (lys_revision *)0x0 &&
              ((plVar5->rev == (lys_revision *)0x0 ||
               (iVar2 = strcmp(plVar3->rev->date,plVar5->rev->date), 0 < iVar2)))))) {
            plVar5 = plVar3;
          }
        }
        else {
          if (plVar3->rev == (lys_revision *)0x0) goto LAB_00110014;
          iVar2 = strcmp(sub_revision,plVar3->rev->date);
          if (iVar2 == 0) {
            return plVar3;
          }
        }
        uVar1 = (ctx->models).used;
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        if (uVar1 <= uVar6) {
          return plVar5;
        }
      } while( true );
    }
  }
  return (lys_submodule *)0x0;
}

Assistant:

lys_submodule *
ly_ctx_get_submodule(const struct ly_ctx *ctx, const char *module, const char *revision, const char *submodule,
                     const char *sub_revision)
{
    const struct lys_module *mainmod;
    const struct lys_submodule *ret = NULL, *submod;
    uint32_t idx = 0;

    if (!ctx || !submodule || (revision && !module)) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    while ((mainmod = ly_ctx_get_module_iter(ctx, &idx))) {
        if (module && strcmp(mainmod->name, module)) {
            /* main module name does not match */
            continue;
        }

        if (revision && (!mainmod->rev || strcmp(revision, mainmod->rev[0].date))) {
            /* main module revision does not match */
            continue;
        }

        submod = ly_ctx_get_submodule2(mainmod, submodule);
        if (!submod) {
            continue;
        }

        if (!sub_revision) {
            /* store only if newer */
            if (ret) {
                if (submod->rev && (!ret->rev || (strcmp(submod->rev[0].date, ret->rev[0].date) > 0))) {
                    ret = submod;
                }
            } else {
                ret = submod;
            }
        } else {
            /* store only if revision matches, we are done if it does */
            if (!submod->rev) {
                continue;
            } else if (!strcmp(sub_revision, submod->rev[0].date)) {
                ret = submod;
                break;
            }
        }
    }

    return ret;
}